

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Resolution * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResolutionAtReturnTime
          (Resolution *__return_storage_ptr__,RpcServerResponseImpl *this,
          ArrayPtr<const_capnp::PipelineOp> ops)

{
  undefined8 uVar1;
  ArrayPtr<const_capnp::PipelineOp> ops_00;
  Own<capnp::ClientHook,_std::nullptr_t> returnedCap;
  Own<capnp::ClientHook,_std::nullptr_t> unwrapped;
  PointerBuilder local_80;
  undefined1 local_68 [24];
  ClientHook *pCStack_50;
  ClientHook *local_38;
  
  ops_00.size_ = ops.ptr;
  getResultsBuilder((Builder *)&local_80,this);
  PointerBuilder::asReader(&local_80);
  ops_00.ptr = (PipelineOp *)(local_68 + 0x10);
  AnyPointer::Reader::getPipelinedCap((Reader *)local_68,ops_00);
  local_68._16_8_ = (WirePointer *)0x0;
  pCStack_50 = (ClientHook *)0x0;
  local_38 = (ClientHook *)local_68._8_8_;
  kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::
  find<capnp::ClientHook*>
            ((HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_80,
             (ClientHook **)&this->resolutionsAtReturnTime);
  if (local_80.segment == (SegmentBuilder *)0x0) {
    (*(*(_func_int ***)local_68._8_8_)[4])(&local_80);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_68 + 0x10),
               (Own<capnp::ClientHook,_std::nullptr_t> *)&local_80);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_80);
  }
  else {
    (**(code **)(**(long **)&((local_80.segment)->super_SegmentReader).id + 0x20))(&local_80);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_68 + 0x10),
               (Own<capnp::ClientHook,_std::nullptr_t> *)&local_80);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_80);
  }
  uVar1 = local_68._8_8_;
  local_68._8_8_ = (ClientHook *)0x0;
  (__return_storage_ptr__->returnedCap).disposer = (Disposer *)local_68._0_8_;
  (__return_storage_ptr__->returnedCap).ptr = (ClientHook *)uVar1;
  (__return_storage_ptr__->unwrapped).disposer = (Disposer *)local_68._16_8_;
  (__return_storage_ptr__->unwrapped).ptr = pCStack_50;
  pCStack_50 = (ClientHook *)0x0;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_68 + 0x10));
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Resolution getResolutionAtReturnTime(kj::ArrayPtr<const PipelineOp> ops) {
      auto returnedCap = getResultsBuilder().asReader().getPipelinedCap(ops);
      kj::Own<ClientHook> unwrapped;
      KJ_IF_SOME(u, resolutionsAtReturnTime.find(returnedCap.get())) {
        unwrapped = u->addRef();
      } else {
        unwrapped = returnedCap->addRef();
      }